

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexCompareVerifier.cpp
# Opt level: O1

bool tcu::isCubeLevelCompareResultValid
               (TextureCubeView *texture,int levelNdx,Sampler *sampler,FilterMode filterMode,
               TexComparePrecision *prec,CubeFaceFloatCoords *coords,float cmpReference,float result
               )

{
  int *piVar1;
  int iVar2;
  ConstPixelBufferAccess *pCVar3;
  TextureFormat TVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  ConstPixelBufferAccess **ppCVar12;
  ulong uVar13;
  CubeFaceFloatCoords *pCVar14;
  float fVar15;
  float fVar16;
  CubeFaceIntCoords CVar17;
  CubeFaceIntCoords CVar18;
  CubeFaceIntCoords CVar19;
  Vec4 depths;
  Vec2 uBounds;
  Vec2 vBounds;
  ConstPixelBufferAccess faces [6];
  bool local_20d;
  Vec4 local_208;
  float local_1f8;
  float local_1f4;
  ulong local_1f0;
  float local_1e4;
  ulong local_1e0;
  ulong local_1d8;
  uint local_1d0;
  int local_1cc;
  uint local_1c8;
  float local_1c4;
  float local_1c0;
  float local_1bc;
  int local_1b8;
  int local_1b4;
  float local_1b0;
  float local_1ac;
  CubeFaceFloatCoords *local_1a8;
  Vec2 local_1a0;
  Vec2 local_198;
  float local_190;
  float local_18c;
  undefined1 local_188 [16];
  TexComparePrecision *local_170;
  ulong local_168;
  Sampler *local_160;
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [20];
  undefined8 uStack_114;
  undefined8 auStack_108 [27];
  
  if (filterMode == LINEAR) {
    if (sampler->seamlessCubeMap == true) {
      ppCVar12 = texture->m_levels;
      lVar8 = (long)levelNdx;
      local_1f0 = lVar8;
      local_1c0 = cmpReference;
      local_1bc = result;
      bVar7 = isFixedPointDepthTextureFormat(&texture->m_levels[0][lVar8].m_format);
      local_1e0 = CONCAT71(local_1e0._1_7_,bVar7);
      iVar2 = texture->m_levels[coords->face][lVar8].m_size.m_data[0];
      TexVerifierUtil::computeNonNormalizedCoordBounds
                ((TexVerifierUtil *)&local_1b0,sampler->normalizedCoords,iVar2,coords->s,
                 *(int *)prec,*(int *)(prec + 0xc));
      local_1b4 = iVar2;
      local_1a8 = coords;
      local_160 = sampler;
      TexVerifierUtil::computeNonNormalizedCoordBounds
                ((TexVerifierUtil *)&local_190,sampler->normalizedCoords,iVar2,coords->t,
                 *(int *)(prec + 4),*(int *)(prec + 0x10));
      fVar16 = local_1b0 + -0.5;
      local_1f4 = local_1ac + -0.5;
      local_1d8 = CONCAT44(local_1d8._4_4_,local_190 + -0.5);
      local_1f8 = local_18c + -0.5;
      lVar8 = 0;
      do {
        ConstPixelBufferAccess::ConstPixelBufferAccess
                  ((ConstPixelBufferAccess *)(local_128 + lVar8));
        lVar8 = lVar8 + 0x28;
      } while (lVar8 != 0xf0);
      local_188._0_4_ = floorf(fVar16);
      fVar16 = floorf((float)local_1d8);
      uVar10 = (uint)(float)local_188._0_4_;
      lVar8 = 0;
      do {
        pCVar3 = *ppCVar12;
        *(void **)(local_128 + lVar8 * 8 + 0x20) = pCVar3[local_1f0].m_data;
        TVar4 = pCVar3[local_1f0].m_format;
        uVar5 = *(undefined8 *)pCVar3[local_1f0].m_size.m_data;
        piVar1 = pCVar3[local_1f0].m_size.m_data + 2;
        uVar6 = *(undefined8 *)(piVar1 + 2);
        *(undefined8 *)(local_128 + (lVar8 * 2 + -1) * 4 + 0x14) = *(undefined8 *)piVar1;
        *(undefined8 *)(local_128 + (lVar8 * 2 + 1) * 4 + 0x14) = uVar6;
        *(TextureFormat *)(local_128 + (lVar8 * 2 + -2) * 4 + 8) = TVar4;
        *(undefined8 *)(local_128 + lVar8 * 8 + 8) = uVar5;
        lVar8 = lVar8 + 5;
        ppCVar12 = ppCVar12 + 1;
      } while (lVar8 != 0x1e);
      fVar15 = floorf(local_1f4);
      local_1f0 = CONCAT44(local_1f0._4_4_,fVar15);
      fVar15 = floorf(local_1f8);
      local_1e4 = (float)(int)fVar16;
      local_1cc = (int)fVar15;
      local_20d = (int)local_1e4 <= local_1cc;
      if ((int)local_1e4 <= local_1cc) {
        local_1b8 = (int)(float)local_1f0;
        local_20d = true;
        local_1c8 = (uint)(byte)local_1e0;
        pCVar14 = local_1a8;
        local_1d0 = uVar10;
        local_170 = prec;
        do {
          local_168 = (ulong)(uint)local_1e4;
          local_1c4 = (float)(int)local_1e4;
          uVar9 = (ulong)local_1d0;
          local_1e4 = (float)((int)local_1e4 + 1);
          while (iVar2 = local_1b4, iVar11 = (int)uVar9, iVar11 <= local_1b8) {
            local_208.m_data[1] = (float)iVar11;
            local_208.m_data[0] = (float)pCVar14->face;
            fVar16 = (float)local_168;
            local_208.m_data[2] = fVar16;
            CVar17 = remapCubeEdgeCoords((CubeFaceIntCoords *)&local_208,local_1b4);
            uVar10 = iVar11 + 1;
            local_208.m_data[1] = (float)uVar10;
            local_208.m_data[0] = (float)pCVar14->face;
            local_208.m_data[2] = fVar16;
            CVar18 = remapCubeEdgeCoords((CubeFaceIntCoords *)&local_208,iVar2);
            fVar16 = local_1e4;
            local_1f8 = (float)CVar18.t;
            local_1f0 = CVar18._0_8_;
            local_208.m_data[1] = (float)iVar11;
            local_208.m_data[0] = (float)pCVar14->face;
            local_208.m_data[2] = local_1e4;
            CVar18 = remapCubeEdgeCoords((CubeFaceIntCoords *)&local_208,iVar2);
            local_1f4 = (float)CVar18.t;
            local_208.m_data[1] = (float)uVar10;
            local_208.m_data[0] = (float)pCVar14->face;
            local_208.m_data[2] = fVar16;
            CVar19 = remapCubeEdgeCoords((CubeFaceIntCoords *)&local_208,iVar2);
            uVar9 = CVar17._0_8_ & 0xffffffff;
            if (uVar9 == 6) {
              return local_20d;
            }
            if (CVar18.face == CUBEFACE_LAST) {
              return local_20d;
            }
            uVar13 = local_1f0 & 0xffffffff;
            if ((float)local_1f0 == 8.40779e-45) {
              return local_20d;
            }
            local_1e0 = CVar19._0_8_ & 0xffffffff;
            if (CVar19.face == CUBEFACE_LAST) {
              return local_20d;
            }
            fVar15 = (local_1b0 + -0.5) - (float)iVar11;
            fVar16 = 1.0;
            if (fVar15 <= 1.0) {
              fVar16 = fVar15;
            }
            local_188 = ZEXT416(~-(uint)(fVar15 < 0.0) & (uint)fVar16);
            fVar15 = (local_1ac + -0.5) - (float)iVar11;
            fVar16 = 1.0;
            if (fVar15 <= 1.0) {
              fVar16 = fVar15;
            }
            local_138 = ZEXT416(~-(uint)(fVar15 < 0.0) & (uint)fVar16);
            fVar15 = (local_190 + -0.5) - local_1c4;
            fVar16 = 1.0;
            if (fVar15 <= 1.0) {
              fVar16 = fVar15;
            }
            local_148 = ZEXT416(~-(uint)(fVar15 < 0.0) & (uint)fVar16);
            fVar15 = (local_18c + -0.5) - local_1c4;
            fVar16 = 1.0;
            if (fVar15 <= 1.0) {
              fVar16 = fVar15;
            }
            local_158 = ZEXT416(~-(uint)(fVar15 < 0.0) & (uint)fVar16);
            local_208.m_data[0] = 0.0;
            local_208.m_data[1] = 0.0;
            local_208.m_data[2] = 0.0;
            local_208.m_data[3] = 0.0;
            local_1d8 = (ulong)uVar10;
            fVar16 = ConstPixelBufferAccess::getPixDepth
                               ((ConstPixelBufferAccess *)(local_128 + uVar9 * 0x28),CVar17.s,
                                CVar17.t,0);
            local_208.m_data[0] = fVar16;
            fVar16 = ConstPixelBufferAccess::getPixDepth
                               ((ConstPixelBufferAccess *)(local_128 + uVar13 * 0x28),
                                (int)(local_1f0 >> 0x20),(int)local_1f8,0);
            local_208.m_data[1] = fVar16;
            fVar16 = ConstPixelBufferAccess::getPixDepth
                               ((ConstPixelBufferAccess *)
                                (local_128 + (CVar18._0_8_ & 0xffffffff) * 0x28),CVar18.s,
                                (int)local_1f4,0);
            local_208.m_data[2] = fVar16;
            fVar16 = ConstPixelBufferAccess::getPixDepth
                               ((ConstPixelBufferAccess *)(local_128 + local_1e0 * 0x28),CVar19.s,
                                CVar19.t,0);
            local_208.m_data[3] = fVar16;
            local_198.m_data[0] = (float)local_188._0_4_;
            local_198.m_data[1] = (float)local_138._0_4_;
            local_1a0.m_data[0] = (float)local_148._0_4_;
            local_1a0.m_data[1] = (float)local_158._0_4_;
            bVar7 = isBilinearCompareValid
                              (local_160->compare,local_170,&local_208,&local_198,&local_1a0,
                               local_1c0,local_1bc,SUB41(local_1c8,0));
            uVar9 = local_1d8;
            pCVar14 = local_1a8;
            if (bVar7) {
              return local_20d;
            }
          }
          local_20d = (int)local_1e4 <= local_1cc;
        } while ((int)local_1e4 <= local_1cc);
      }
    }
    else {
      local_128._0_4_ = coords->s;
      local_128._4_4_ = coords->t;
      local_20d = isLinearCompareResultValid
                            (texture->m_levels[coords->face] + levelNdx,sampler,prec,
                             (Vec2 *)local_128,0,cmpReference,result);
    }
  }
  else {
    local_128._0_4_ = coords->s;
    local_128._4_4_ = coords->t;
    local_20d = isNearestCompareResultValid
                          (texture->m_levels[coords->face] + levelNdx,sampler,prec,(Vec2 *)local_128
                           ,0,cmpReference,result);
  }
  return local_20d;
}

Assistant:

static bool isCubeLevelCompareResultValid (const TextureCubeView&			texture,
										   const int						levelNdx,
										   const Sampler&					sampler,
										   const Sampler::FilterMode		filterMode,
										   const TexComparePrecision&		prec,
										   const CubeFaceFloatCoords&		coords,
										   const float						cmpReference,
										   const float						result)
{
	if (filterMode == Sampler::LINEAR)
	{
		if (sampler.seamlessCubeMap)
			return isSeamlessLinearCompareResultValid(texture, levelNdx, sampler, prec, coords, cmpReference, result);
		else
			return isLinearCompareResultValid(texture.getLevelFace(levelNdx, coords.face), sampler, prec, Vec2(coords.s, coords.t), 0, cmpReference, result);
	}
	else
		return isNearestCompareResultValid(texture.getLevelFace(levelNdx, coords.face), sampler, prec, Vec2(coords.s, coords.t), 0, cmpReference, result);
}